

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChakraRtInterface.cpp
# Opt level: O0

HRESULT ChakraRTInterface::OnChakraCoreLoaded(TestHooks *testHooks)

{
  TestHooks *testHooks_local;
  
  if (m_testHooksInitialized) {
    testHooks_local._4_4_ = 0;
  }
  else {
    memcpy(&m_testHooks,testHooks,0x2a50);
    m_testHooksSetup = true;
    m_testHooksInitialized = true;
    testHooks_local._4_4_ = ParseConfigFlags();
  }
  return testHooks_local._4_4_;
}

Assistant:

HRESULT ChakraRTInterface::OnChakraCoreLoaded(TestHooks& testHooks)
{
    if (!m_testHooksInitialized)
    {
        m_testHooks = testHooks;
        m_testHooksSetup = true;
        m_testHooksInitialized = true;
        return ParseConfigFlags();
    }

    return S_OK;
}